

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

void __thiscall VFS::CVFS::CVFSFile::ReserveChunks(CVFSFile *this,size_t Count)

{
  SChunk *this_00;
  bool bVar1;
  __shared_ptr<VFS::CVFS::CVFSFile::SChunk,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::
  vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
  ::reserve(&this->m_Data,Count);
  while (bVar1 = Count != 0, Count = Count - 1, bVar1) {
    this_00 = (SChunk *)operator_new(0x10);
    SChunk::SChunk(this_00);
    std::__shared_ptr<VFS::CVFS::CVFSFile::SChunk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VFS::CVFS::CVFSFile::SChunk,void>(local_40,this_00);
    std::
    vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>>>
    ::emplace_back<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>>
              ((vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>>>
                *)&this->m_Data,(shared_ptr<VFS::CVFS::CVFSFile::SChunk> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  return;
}

Assistant:

void ReserveChunks(size_t Count)
                    {
                        m_Data.reserve(Count);
                        for (size_t i = 0; i < Count; i++)
                            m_Data.push_back(Chunk(new SChunk()));
                    }